

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O1

void __thiscall
aggreports::MeanDamageRatioWithWeighting
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar)

{
  _Rb_tree_header *p_Var1;
  pointer pmVar2;
  _Base_ptr p_Var3;
  iterator __position;
  code *pcVar4;
  _Base_ptr p_Var5;
  vector<lossval,std::allocator<lossval>> *this_00;
  _Base_ptr p_Var6;
  undefined4 in_register_0000000c;
  _Rb_tree_header *p_Var7;
  long *plVar8;
  _Base_ptr p_Var9;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_double>_>,_std::_Rb_tree_iterator<std::pair<const_int,_double>_>_>
  pVar10;
  int in_stack_00000008;
  pair<const_outkey2,_OutLosses> x;
  lossval lv;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  unusedperiodstoweighting;
  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  items;
  
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &items._M_t._M_impl.super__Rb_tree_header._M_header;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::_Rb_tree(&unusedperiodstoweighting._M_t,&(this->periodstoweighting_)._M_t);
  pmVar2 = (this->out_loss_->
           super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var6 = *(_Base_ptr *)((long)&(pmVar2->_M_t)._M_impl.super__Rb_tree_header + 0x10);
  p_Var9 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != p_Var9) {
    plVar8 = (long *)((long)&x.second.agg_out_loss + CONCAT44(in_register_0000000c,epcalc));
    p_Var1 = &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header;
    do {
      x.second.max_out_loss = *(OASIS_FLOAT *)&p_Var6[1]._M_left;
      x.first.summary_id = p_Var6[1]._M_color;
      x.first.period_no = *(int *)&p_Var6[1].field_0x4;
      x.first.sidx = *(int *)&p_Var6[1]._M_parent;
      x.second.agg_out_loss = *(OASIS_FLOAT *)((long)&p_Var6[1]._M_parent + 4);
      pcVar4 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        pcVar4 = *(code **)(*plVar8 + -1 + GetOutLoss);
      }
      lv.value = (OASIS_FLOAT)(*pcVar4)(plVar8);
      p_Var3 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < x.first.period_no]) {
        if (x.first.period_no <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var5 = p_Var3;
        }
      }
      p_Var7 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var7 = (_Rb_tree_header *)p_Var5,
         x.first.period_no < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var7 = p_Var1;
      }
      if (p_Var7 != p_Var1) {
        lv.period_weighting = *(double *)(p_Var7 + 1);
        lv.period_no = x.first.period_no;
        this_00 = (vector<lossval,std::allocator<lossval>> *)
                  std::
                  map<int,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
                  ::operator[](&items,(key_type *)&x);
        __position._M_current = *(lossval **)(this_00 + 8);
        if (__position._M_current == *(lossval **)(this_00 + 0x10)) {
          std::vector<lossval,std::allocator<lossval>>::_M_realloc_insert<lossval_const&>
                    (this_00,__position,&lv);
        }
        else {
          *(ulong *)&(__position._M_current)->value = CONCAT44(lv._20_4_,lv.value);
          *(ulong *)__position._M_current = CONCAT44(lv._4_4_,lv.period_no);
          (__position._M_current)->period_weighting = lv.period_weighting;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
        }
      }
      pVar10 = std::
               _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::equal_range(&unusedperiodstoweighting._M_t,&x.first.period_no);
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_M_erase_aux(&unusedperiodstoweighting._M_t,(_Base_ptr)pVar10.first._M_node,
                     (_Base_ptr)pVar10.second._M_node);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var9);
  }
  WriteExceedanceProbabilityTable
            (this,fileIDs,&items,(float)this->samplesize_,eptype,eptype_tvar,in_stack_00000008,
             &unusedperiodstoweighting,1);
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree(&unusedperiodstoweighting._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  ::~_Rb_tree(&items._M_t);
  return;
}

Assistant:

void aggreports::MeanDamageRatioWithWeighting(const std::vector<int> &fileIDs,
	OASIS_FLOAT (OutLosses::*GetOutLoss)(), const int epcalc,
	const int eptype, const int eptype_tvar) {

  std::map<int, lossvec2> items;
  std::map<int, double> unusedperiodstoweighting = periodstoweighting_;

  for (auto x : (*out_loss_)[MEANS]) {
    lossval lv;
    lv.value = (x.second.*GetOutLoss)();
    auto iter = periodstoweighting_.find(x.first.period_no);
    if (iter != periodstoweighting_.end()) {
      lv.period_weighting = iter->second;
      lv.period_no = x.first.period_no;   // for debugging
      items[x.first.summary_id].push_back(lv);
    }
    unusedperiodstoweighting.erase(x.first.period_no);
  }

  WriteExceedanceProbabilityTable(fileIDs, items, samplesize_, epcalc, eptype,
				  eptype_tvar, unusedperiodstoweighting);

}